

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

int __thiscall ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob)

{
  float fVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  int i;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  Mat local_60;
  
  uVar6 = bottom_top_blob->h * bottom_top_blob->w;
  uVar8 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar8;
  }
  for (; (long)uVar8 < (long)this->channels; uVar8 = uVar8 + 1) {
    Mat::channel(&local_60,bottom_top_blob,(int)uVar8);
    pvVar4 = local_60.data;
    Mat::~Mat(&local_60);
    fVar10 = 0.0;
    fVar9 = 0.0;
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      fVar1 = *(float *)((long)pvVar4 + uVar5 * 4);
      fVar9 = fVar9 + fVar1;
      fVar10 = fVar10 + fVar1 * fVar1;
    }
    fVar9 = fVar9 * (1.0 / (float)(int)uVar6);
    fVar1 = *(float *)((long)(this->gamma_data).data + uVar8 * 4);
    fVar2 = this->eps;
    fVar3 = *(float *)((long)(this->beta_data).data + uVar8 * 4);
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      *(float *)((long)pvVar4 + uVar5 * 4) =
           (*(float *)((long)pvVar4 + uVar5 * 4) - fVar9) * fVar1 *
           (1.0 / (SQRT(fVar10 * (1.0 / (float)(int)uVar6) - fVar9 * fVar9) + fVar2)) + fVar3;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob) const
{
    // x = (x - mean) / (sqrt(var) + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i=0; i<size; i++)
        {
            sum += ptr[i];
            sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float var = sqsum / size - mean * mean;

        float gamma = gamma_data[q];
        float beta = beta_data[q];

        float a = gamma / (sqrt(var) + eps);
        float b = - mean * a + beta;

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}